

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,FaceVaryingLinearInterpolation v)

{
  FaceVaryingLinearInterpolation v_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xffffffff) {
  case 0:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"cornersPlus1");
    break;
  case 1:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"cornersPlus2");
    break;
  case 2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"cornersOnly");
    break;
  case 3:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"boundaries");
    break;
  case 4:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"none");
    break;
  case 5:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"all");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::GeomMesh::FaceVaryingLinearInterpolation v) {
  std::string s;

  switch (v) {
    case tinyusdz::GeomMesh::FaceVaryingLinearInterpolation::CornersPlus1: {
      s = "cornersPlus1";
      break;
    }
    case tinyusdz::GeomMesh::FaceVaryingLinearInterpolation::CornersPlus2: {
      s = "cornersPlus2";
      break;
    }
    case tinyusdz::GeomMesh::FaceVaryingLinearInterpolation::CornersOnly: {
      s = "cornersOnly";
      break;
    }
    case tinyusdz::GeomMesh::FaceVaryingLinearInterpolation::Boundaries: {
      s = "boundaries";
      break;
    }
    case tinyusdz::GeomMesh::FaceVaryingLinearInterpolation::
        FaceVaryingLinearInterpolationNone: {
      s = "none";
      break;
    }
    case tinyusdz::GeomMesh::FaceVaryingLinearInterpolation::All: {
      s = "all";
      break;
    }
  }

  return s;
}